

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool modify_monster_trap(loc_conflict grid)

{
  _Bool _Var1;
  loc_conflict grid_local;
  
  if ((player->timed[2] != 0) || (_Var1 = no_light(player), _Var1)) {
    msg("You can not see to modify your trap.");
    grid_local.x._3_1_ = false;
  }
  else if ((player->timed[4] == 0) && (player->timed[6] == 0)) {
    _Var1 = player_is_shapechanged(player);
    if (_Var1) {
      msg("You cannot do this while in %s form.",player->shape->name);
      _Var1 = get_check("Do you want to change back? ");
      if (!_Var1) {
        return false;
      }
      player_resume_normal_shape(player);
    }
    mtrap_grid = grid;
    _Var1 = mtrap_menu();
    if (_Var1) {
      msg("You modify the monster trap.");
    }
    grid_local.x._3_1_ = true;
  }
  else {
    msg("You are too confused.");
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

bool modify_monster_trap(struct loc grid)
{
	if (player->timed[TMD_BLIND] || no_light(player)) {
		msg("You can not see to modify your trap.");
		return false;
	}

	if (player->timed[TMD_CONFUSED] || player->timed[TMD_IMAGE]) {
		msg("You are too confused.");
		return false;
	}

	/* No setting traps while shapeshifted */
	if (player_is_shapechanged(player)) {
		msg("You cannot do this while in %s form.",	player->shape->name);
		if (get_check("Do you want to change back? " )) {
			player_resume_normal_shape(player);
		} else {
			return false;
		}
	}

	mtrap_grid = grid;

	/* Get choice */
	if (mtrap_menu()) {
		/* Notify the player. */
		msg("You modify the monster trap.");
	}

	/* Trap was modified */
	return true;
}